

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_functions.cpp
# Opt level: O2

Value * duckdb::AggregateFunctionExtractor::GetVarArgs
                  (Value *__return_storage_ptr__,AggregateFunctionCatalogEntry *entry,idx_t offset)

{
  bool bVar1;
  LogicalType LStack_178;
  string local_160;
  AggregateFunction fun;
  
  FunctionSet<duckdb::AggregateFunction>::GetFunctionByOffset
            (&fun,&(entry->functions).super_FunctionSet<duckdb::AggregateFunction>,offset);
  bVar1 = SimpleFunction::HasVarArgs((SimpleFunction *)&fun);
  if (bVar1) {
    LogicalType::ToString_abi_cxx11_
              (&local_160,&fun.super_BaseScalarFunction.super_SimpleFunction.varargs);
    Value::Value(__return_storage_ptr__,(string *)&local_160);
    ::std::__cxx11::string::~string((string *)&local_160);
  }
  else {
    LogicalType::LogicalType(&LStack_178,SQLNULL);
    Value::Value(__return_storage_ptr__,&LStack_178);
    LogicalType::~LogicalType(&LStack_178);
  }
  AggregateFunction::~AggregateFunction(&fun);
  return __return_storage_ptr__;
}

Assistant:

static Value GetVarArgs(AggregateFunctionCatalogEntry &entry, idx_t offset) {
		auto fun = entry.functions.GetFunctionByOffset(offset);
		return !fun.HasVarArgs() ? Value() : Value(fun.varargs.ToString());
	}